

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O2

int ly_utf8_less(char *input,int bytes,...)

{
  byte *pbVar1;
  char in_AL;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar3;
  ulong uVar4;
  undefined8 in_R8;
  byte *pbVar5;
  ulong uVar6;
  byte *pbVar7;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  void *in_XMM1_Qa;
  byte local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  va_list ap;
  
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if (in_AL != '\0') {
    uStack_88 = in_XMM0_Qa;
    ap[0].overflow_arg_area = in_XMM1_Qa;
  }
  pbVar5 = &stack0x00000008;
  uVar2 = 0x10;
  uVar3 = 0;
  uVar4 = (ulong)(uint)bytes;
  if (bytes < 1) {
    uVar4 = uVar3;
  }
  while( true ) {
    if (uVar4 == uVar3) {
      return 0;
    }
    if (uVar2 < 0x29) {
      uVar6 = (ulong)uVar2;
      uVar2 = uVar2 + 8;
      pbVar7 = local_b8 + uVar6;
    }
    else {
      pbVar7 = pbVar5;
      pbVar5 = pbVar5 + 8;
    }
    pbVar1 = (byte *)(input + uVar3);
    if (*pbVar7 < *pbVar1) break;
    uVar3 = uVar3 + 1;
    if (*pbVar1 < *pbVar7) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
ly_utf8_less(const char *input, int bytes, ...)
{
    va_list ap;
    int i, byte;

    va_start(ap, bytes);
    for (i = 0; i < bytes; ++i) {
        byte = va_arg(ap, int);

        /* compare until bytes differ */
        if ((uint8_t)input[i] > (uint8_t)byte) {
            return 0;
        } else if ((uint8_t)input[i] < (uint8_t)byte) {
            return 1;
        }
    }
    va_end(ap);

    /* equals */
    return 0;
}